

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

void __thiscall cmLocalGenerator::GenerateTestFiles(cmLocalGenerator *this)

{
  cmStateSnapshot *this_00;
  cmMakefile *pcVar1;
  pointer ppcVar2;
  cmTestGenerator *this_01;
  cmLocalGenerator *pcVar3;
  size_type sVar4;
  bool bVar5;
  string *psVar6;
  ostream *poVar7;
  char *pcVar8;
  char *__s;
  string *i;
  _Alloc_hider _Var9;
  pointer ppcVar10;
  cmStateSnapshot *i_1;
  allocator<char> local_369;
  cmLocalGenerator *local_368;
  cmStateDirectory local_360;
  string outP;
  string parentBinDir;
  _Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_> local_2f0;
  string file;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configurationTypes;
  string local_298;
  cmGeneratedFileStream fout;
  
  pcVar1 = this->Makefile;
  local_368 = this;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fout,"CMAKE_TESTING_ENABLED",(allocator<char> *)&local_360);
  bVar5 = cmMakefile::IsOn(pcVar1,(string *)&fout);
  std::__cxx11::string::~string((string *)&fout);
  pcVar3 = local_368;
  if (!bVar5) {
    return;
  }
  configurationTypes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  configurationTypes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  configurationTypes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmMakefile::GetConfigurations(&local_298,local_368->Makefile,&configurationTypes,false);
  this_00 = &pcVar3->StateSnapshot;
  cmStateSnapshot::GetDirectory((cmStateDirectory *)&fout,this_00);
  psVar6 = cmStateDirectory::GetCurrentBinary_abi_cxx11_((cmStateDirectory *)&fout);
  std::__cxx11::string::string((string *)&file,(string *)psVar6);
  std::__cxx11::string::append((char *)&file);
  std::__cxx11::string::append((char *)&file);
  cmGeneratedFileStream::cmGeneratedFileStream(&fout,&file,false,None);
  cmGeneratedFileStream::SetCopyIfDifferent(&fout,true);
  poVar7 = std::operator<<((ostream *)&fout,"# CMake generated Testfile for ");
  poVar7 = std::endl<char,std::char_traits<char>>(poVar7);
  poVar7 = std::operator<<(poVar7,"# Source directory: ");
  cmStateSnapshot::GetDirectory(&local_360,this_00);
  psVar6 = cmStateDirectory::GetCurrentSource_abi_cxx11_(&local_360);
  poVar7 = std::operator<<(poVar7,(string *)psVar6);
  poVar7 = std::endl<char,std::char_traits<char>>(poVar7);
  poVar7 = std::operator<<(poVar7,"# Build directory: ");
  cmStateSnapshot::GetDirectory((cmStateDirectory *)&parentBinDir,this_00);
  psVar6 = cmStateDirectory::GetCurrentBinary_abi_cxx11_((cmStateDirectory *)&parentBinDir);
  poVar7 = std::operator<<(poVar7,(string *)psVar6);
  poVar7 = std::endl<char,std::char_traits<char>>(poVar7);
  poVar7 = std::operator<<(poVar7,"# ");
  poVar7 = std::endl<char,std::char_traits<char>>(poVar7);
  poVar7 = std::operator<<(poVar7,"# This file includes the relevant testing commands ");
  poVar7 = std::operator<<(poVar7,"required for ");
  poVar7 = std::endl<char,std::char_traits<char>>(poVar7);
  poVar7 = std::operator<<(poVar7,"# testing this directory and lists subdirectories to ");
  poVar7 = std::operator<<(poVar7,"be tested as well.");
  std::endl<char,std::char_traits<char>>(poVar7);
  pcVar1 = local_368->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_360,"TEST_INCLUDE_FILE",(allocator<char> *)&parentBinDir);
  pcVar8 = cmMakefile::GetProperty(pcVar1,(string *)&local_360);
  std::__cxx11::string::~string((string *)&local_360);
  if (pcVar8 != (char *)0x0) {
    poVar7 = std::operator<<((ostream *)&fout,"include(\"");
    poVar7 = std::operator<<(poVar7,pcVar8);
    poVar7 = std::operator<<(poVar7,"\")");
    std::endl<char,std::char_traits<char>>(poVar7);
  }
  pcVar1 = local_368->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_360,"TEST_INCLUDE_FILES",(allocator<char> *)&parentBinDir);
  pcVar8 = cmMakefile::GetProperty(pcVar1,(string *)&local_360);
  std::__cxx11::string::~string((string *)&local_360);
  if (pcVar8 != (char *)0x0) {
    parentBinDir._M_dataplus._M_p = (pointer)0x0;
    parentBinDir._M_string_length = 0;
    parentBinDir.field_2._M_allocated_capacity = 0;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_360,pcVar8,(allocator<char> *)&outP);
    cmSystemTools::ExpandListArgument
              ((string *)&local_360,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&parentBinDir,false);
    std::__cxx11::string::~string((string *)&local_360);
    sVar4 = parentBinDir._M_string_length;
    for (_Var9 = parentBinDir._M_dataplus; _Var9._M_p != (pointer)sVar4;
        _Var9._M_p = _Var9._M_p + 0x20) {
      poVar7 = std::operator<<((ostream *)&fout,"include(\"");
      poVar7 = std::operator<<(poVar7,(string *)_Var9._M_p);
      poVar7 = std::operator<<(poVar7,"\")");
      std::endl<char,std::char_traits<char>>(poVar7);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&parentBinDir);
  }
  ppcVar2 = (local_368->Makefile->TestGenerators).
            super__Vector_base<cmTestGenerator_*,_std::allocator<cmTestGenerator_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppcVar10 = (local_368->Makefile->TestGenerators).
                  super__Vector_base<cmTestGenerator_*,_std::allocator<cmTestGenerator_*>_>._M_impl.
                  super__Vector_impl_data._M_start; ppcVar10 != ppcVar2; ppcVar10 = ppcVar10 + 1) {
    this_01 = *ppcVar10;
    cmTestGenerator::Compute(this_01,local_368);
    cmScriptGenerator::Generate
              (&this_01->super_cmScriptGenerator,(ostream *)&fout,&local_298,&configurationTypes);
  }
  cmMakefile::GetStateSnapshot(local_368->Makefile);
  cmStateSnapshot::GetChildren
            ((vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_> *)&local_2f0,
             (cmStateSnapshot *)&local_360);
  psVar6 = GetCurrentBinaryDirectory_abi_cxx11_(local_368);
  std::__cxx11::string::string((string *)&parentBinDir,(string *)psVar6);
  for (; local_2f0._M_impl.super__Vector_impl_data._M_start !=
         local_2f0._M_impl.super__Vector_impl_data._M_finish;
      local_2f0._M_impl.super__Vector_impl_data._M_start =
           local_2f0._M_impl.super__Vector_impl_data._M_start + 1) {
    cmStateSnapshot::GetDirectory(&local_360,local_2f0._M_impl.super__Vector_impl_data._M_start);
    psVar6 = cmStateDirectory::GetCurrentBinary_abi_cxx11_(&local_360);
    std::__cxx11::string::string((string *)&outP,(string *)psVar6);
    MaybeConvertToRelativePath((string *)&local_360,local_368,&parentBinDir,&outP);
    std::__cxx11::string::operator=((string *)&outP,(string *)&local_360);
    std::__cxx11::string::~string((string *)&local_360);
    cmOutputConverter::EscapeForCMake((string *)&local_360,&outP);
    std::__cxx11::string::operator=((string *)&outP,(string *)&local_360);
    std::__cxx11::string::~string((string *)&local_360);
    poVar7 = std::operator<<((ostream *)&fout,"subdirs(");
    poVar7 = std::operator<<(poVar7,(string *)&outP);
    poVar7 = std::operator<<(poVar7,")");
    std::endl<char,std::char_traits<char>>(poVar7);
    std::__cxx11::string::~string((string *)&outP);
  }
  pcVar1 = local_368->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_360,"CMAKE_DIRECTORY_LABELS",(allocator<char> *)&outP);
  pcVar8 = cmMakefile::GetDefinition(pcVar1,(string *)&local_360);
  std::__cxx11::string::~string((string *)&local_360);
  pcVar1 = local_368->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_360,"LABELS",(allocator<char> *)&outP);
  __s = cmMakefile::GetProperty(pcVar1,(string *)&local_360);
  std::__cxx11::string::~string((string *)&local_360);
  if (pcVar8 == (char *)0x0 && __s == (char *)0x0) goto LAB_00151864;
  std::operator<<((ostream *)&fout,"set_directory_properties(PROPERTIES LABELS ");
  if (__s == (char *)0x0) {
    if (pcVar8 != (char *)0x0) goto LAB_00151801;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&outP,__s,&local_369);
    cmOutputConverter::EscapeForCMake((string *)&local_360,&outP);
    std::operator<<((ostream *)&fout,(string *)&local_360);
    std::__cxx11::string::~string((string *)&local_360);
    std::__cxx11::string::~string((string *)&outP);
    if (pcVar8 != (char *)0x0) {
      std::operator<<((ostream *)&fout,";");
LAB_00151801:
      std::__cxx11::string::string<std::allocator<char>>((string *)&outP,pcVar8,&local_369);
      cmOutputConverter::EscapeForCMake((string *)&local_360,&outP);
      std::operator<<((ostream *)&fout,(string *)&local_360);
      std::__cxx11::string::~string((string *)&local_360);
      std::__cxx11::string::~string((string *)&outP);
    }
  }
  poVar7 = std::operator<<((ostream *)&fout,")");
  std::endl<char,std::char_traits<char>>(poVar7);
LAB_00151864:
  std::__cxx11::string::~string((string *)&parentBinDir);
  std::_Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>::~_Vector_base(&local_2f0);
  cmGeneratedFileStream::~cmGeneratedFileStream(&fout);
  std::__cxx11::string::~string((string *)&file);
  std::__cxx11::string::~string((string *)&local_298);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&configurationTypes);
  return;
}

Assistant:

void cmLocalGenerator::GenerateTestFiles()
{
  if (!this->Makefile->IsOn("CMAKE_TESTING_ENABLED")) {
    return;
  }

  // Compute the set of configurations.
  std::vector<std::string> configurationTypes;
  const std::string& config =
    this->Makefile->GetConfigurations(configurationTypes, false);

  std::string file = this->StateSnapshot.GetDirectory().GetCurrentBinary();
  file += "/";
  file += "CTestTestfile.cmake";

  cmGeneratedFileStream fout(file);
  fout.SetCopyIfDifferent(true);

  fout << "# CMake generated Testfile for " << std::endl
       << "# Source directory: "
       << this->StateSnapshot.GetDirectory().GetCurrentSource() << std::endl
       << "# Build directory: "
       << this->StateSnapshot.GetDirectory().GetCurrentBinary() << std::endl
       << "# " << std::endl
       << "# This file includes the relevant testing commands "
       << "required for " << std::endl
       << "# testing this directory and lists subdirectories to "
       << "be tested as well." << std::endl;

  const char* testIncludeFile =
    this->Makefile->GetProperty("TEST_INCLUDE_FILE");
  if (testIncludeFile) {
    fout << "include(\"" << testIncludeFile << "\")" << std::endl;
  }

  const char* testIncludeFiles =
    this->Makefile->GetProperty("TEST_INCLUDE_FILES");
  if (testIncludeFiles) {
    std::vector<std::string> includesList;
    cmSystemTools::ExpandListArgument(testIncludeFiles, includesList);
    for (std::string const& i : includesList) {
      fout << "include(\"" << i << "\")" << std::endl;
    }
  }

  // Ask each test generator to write its code.
  std::vector<cmTestGenerator*> const& testers =
    this->Makefile->GetTestGenerators();
  for (cmTestGenerator* tester : testers) {
    tester->Compute(this);
    tester->Generate(fout, config, configurationTypes);
  }
  typedef std::vector<cmStateSnapshot> vec_t;
  vec_t const& children = this->Makefile->GetStateSnapshot().GetChildren();
  std::string parentBinDir = this->GetCurrentBinaryDirectory();
  for (cmStateSnapshot const& i : children) {
    // TODO: Use add_subdirectory instead?
    std::string outP = i.GetDirectory().GetCurrentBinary();
    outP = this->MaybeConvertToRelativePath(parentBinDir, outP);
    outP = cmOutputConverter::EscapeForCMake(outP);
    fout << "subdirs(" << outP << ")" << std::endl;
  }

  // Add directory labels property
  const char* directoryLabels =
    this->Makefile->GetDefinition("CMAKE_DIRECTORY_LABELS");
  const char* labels = this->Makefile->GetProperty("LABELS");

  if (labels || directoryLabels) {
    fout << "set_directory_properties(PROPERTIES LABELS ";
    if (labels) {
      fout << cmOutputConverter::EscapeForCMake(labels);
    }
    if (labels && directoryLabels) {
      fout << ";";
    }
    if (directoryLabels) {
      fout << cmOutputConverter::EscapeForCMake(directoryLabels);
    }
    fout << ")" << std::endl;
  }
}